

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O2

void nvlist_move_nvlist_array(nvlist_t *nvl,char *name,nvlist_t **value,size_t nitems)

{
  int iVar1;
  nvlist_t *pnVar2;
  int *piVar3;
  nvpair_t *nvp;
  size_t sVar4;
  
  iVar1 = nvlist_error(nvl);
  if (iVar1 == 0) {
    nvp = nvpair_move_nvlist_array(name,value,nitems);
    if (nvp != (nvpair_t *)0x0) {
      nvlist_move_nvpair(nvl,nvp);
      return;
    }
    piVar3 = __errno_location();
    iVar1 = 0xc;
    if (*piVar3 != 0) {
      iVar1 = *piVar3;
    }
    nvl->nvl_error = iVar1;
    *piVar3 = iVar1;
  }
  else {
    if (value != (nvlist_t **)0x0) {
      for (sVar4 = 0; nitems != sVar4; sVar4 = sVar4 + 1) {
        pnVar2 = nvlist_get_pararr(value[sVar4],(void **)0x0);
        if (pnVar2 == (nvlist_t *)0x0) {
          nvlist_destroy(value[sVar4]);
        }
      }
    }
    free(value);
    iVar1 = nvlist_error(nvl);
    piVar3 = __errno_location();
    *piVar3 = iVar1;
  }
  return;
}

Assistant:

void
nvlist_move_nvlist_array(nvlist_t *nvl, const char *name, nvlist_t **value,
    size_t nitems)
{
	nvpair_t *nvp;
	size_t i;

	if (nvlist_error(nvl) != 0) {
		if (value != NULL) {
			for (i = 0; i < nitems; i++) {
				if (nvlist_get_pararr(value[i], NULL) == NULL)
					nvlist_destroy(value[i]);
			}
		}
		nv_free(value);
		ERRNO_SET(nvlist_error(nvl));
		return;
	}

	nvp = nvpair_move_nvlist_array(name, value, nitems);
	if (nvp == NULL) {
		nvl->nvl_error = ERRNO_OR_DEFAULT(ENOMEM);
		ERRNO_SET(nvl->nvl_error);
	} else {
		(void)nvlist_move_nvpair(nvl, nvp);
	}
}